

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeFunctionBody.cpp
# Opt level: O0

bool __thiscall JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(JITTimeFunctionBody *this)

{
  JITTimeFunctionBody *this_local;
  
  return false;
}

Assistant:

bool JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer() const
{
    // Using Fast Virtual Buffer means that bounds checks can be omitted
#if ENABLE_FAST_ARRAYBUFFER
#ifdef ENABLE_WASM
    if (IsWasmFunction())
    {
        return CONFIG_FLAG(WasmFastArray);
    }
#endif
    return true;
#else
    return false;
#endif
}